

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureBarrierTests.cpp
# Opt level: O3

IterateResult __thiscall
gl4cts::TextureBarrierBasicOutline::iterate(TextureBarrierBasicOutline *this)

{
  long *plVar1;
  int *piVar2;
  TestLog *log;
  RenderContext *renderCtx;
  long *plVar3;
  bool bVar4;
  int iVar5;
  undefined4 uVar6;
  undefined4 extraout_var;
  ShaderProgram *pSVar8;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  TestError *pTVar9;
  int testPass;
  uint uVar10;
  GLuint i;
  uint uVar11;
  long lVar12;
  SharedPtr<glu::ShaderProgram> program;
  ProgramSources sources;
  allocator<char> local_152;
  allocator<char> local_151;
  ShaderProgram *local_150;
  long *local_148;
  value_type local_140;
  value_type local_120;
  ProgramSources local_100;
  long lVar7;
  
  log = ((this->super_TextureBarrierBaseTest).super_TestCase.super_TestCase.super_TestNode.m_testCtx
        )->m_log;
  iVar5 = (*((this->super_TextureBarrierBaseTest).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar5);
  pSVar8 = (ShaderProgram *)operator_new(0xd0);
  renderCtx = ((this->super_TextureBarrierBaseTest).super_TestCase.m_context)->m_renderCtx;
  iVar5 = (*(this->super_TextureBarrierBaseTest).super_TestCase.super_TestCase.super_TestNode.
            _vptr_TestNode[5])(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_140,(char *)CONCAT44(extraout_var_00,iVar5),&local_151);
  iVar5 = (*(this->super_TextureBarrierBaseTest).super_TestCase.super_TestCase.super_TestNode.
            _vptr_TestNode[6])(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_120,(char *)CONCAT44(extraout_var_01,iVar5),&local_152);
  memset(&local_100,0,0xac);
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_100._193_8_ = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(local_100.sources,&local_140);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(local_100.sources + 1,&local_120);
  glu::ShaderProgram::ShaderProgram(pSVar8,renderCtx,&local_100);
  local_148 = (long *)0x0;
  local_150 = pSVar8;
  local_148 = (long *)operator_new(0x20);
  *(undefined4 *)(local_148 + 1) = 0;
  *(undefined4 *)((long)local_148 + 0xc) = 0;
  *local_148 = (long)&PTR__SharedPtrState_020e0ea0;
  local_148[2] = (long)pSVar8;
  *(undefined4 *)(local_148 + 1) = 1;
  *(undefined4 *)((long)local_148 + 0xc) = 1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_100.transformFeedbackVaryings);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_100.attribLocationBindings);
  lVar12 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&local_100.sources[0].
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar12));
    lVar12 = lVar12 + -0x18;
  } while (lVar12 != -0x18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
  }
  pSVar8 = local_150;
  glu::operator<<(log,local_150);
  if ((pSVar8->m_program).m_info.linkOk != false) {
    *(deUint32 *)&(this->super_TextureBarrierBaseTest).field_0x7c = (pSVar8->m_program).m_program;
    (**(code **)(lVar7 + 0x1680))();
    iVar5 = 0;
    do {
      local_100.sources[0].
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x7475706e49786574;
      local_100.sources[0].
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._0_4_ =
           CONCAT22(0x5d,CONCAT11((char)iVar5 + '0',0x5b));
      uVar6 = (**(code **)(lVar7 + 0xb48))
                        (*(undefined4 *)&(this->super_TextureBarrierBaseTest).field_0x7c,&local_100)
      ;
      (**(code **)(lVar7 + 0x14f0))(uVar6);
      iVar5 = iVar5 + 1;
    } while (iVar5 != 8);
    uVar10 = 0;
    do {
      iVar5 = (*(this->super_TextureBarrierBaseTest).super_TestCase.super_TestCase.super_TestNode.
                _vptr_TestNode[8])(this);
      if (iVar5 <= (int)uVar10) {
        (**(code **)(lVar7 + 0x1680))(0);
        tcu::TestContext::setTestResult
                  ((this->super_TextureBarrierBaseTest).super_TestCase.super_TestCase.super_TestNode
                   .m_testCtx,QP_TEST_RESULT_PASS,"Pass");
        plVar3 = local_148;
        if (local_148 != (long *)0x0) {
          LOCK();
          plVar1 = local_148 + 1;
          *(int *)plVar1 = (int)*plVar1 + -1;
          UNLOCK();
          if ((int)*plVar1 == 0) {
            local_150 = (ShaderProgram *)0x0;
            (**(code **)(*local_148 + 0x10))(local_148);
          }
          LOCK();
          piVar2 = (int *)((long)plVar3 + 0xc);
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if ((*piVar2 == 0) && (local_148 != (long *)0x0)) {
            (**(code **)(*local_148 + 8))();
          }
        }
        return STOP;
      }
      initTextureData(this);
      uVar11 = 0;
      while( true ) {
        iVar5 = (*(this->super_TextureBarrierBaseTest).super_TestCase.super_TestCase.super_TestNode.
                  _vptr_TestNode[9])(this);
        if (iVar5 <= (int)uVar11) break;
        (*(this->super_TextureBarrierBaseTest).super_TestCase.super_TestCase.super_TestNode.
          _vptr_TestNode[10])(this,(ulong)uVar10,(ulong)uVar11);
        render(this);
        iVar5 = (*(this->super_TextureBarrierBaseTest).super_TestCase.super_TestCase.super_TestNode.
                  _vptr_TestNode[0xb])(this);
        if ((char)iVar5 != '\0') {
          (**(code **)(lVar7 + 0x13d0))();
        }
        uVar11 = uVar11 + 1;
      }
      uVar11 = 0;
      while( true ) {
        iVar5 = (*(this->super_TextureBarrierBaseTest).super_TestCase.super_TestCase.super_TestNode.
                  _vptr_TestNode[9])(this);
        if (iVar5 <= (int)uVar11) break;
        (*(this->super_TextureBarrierBaseTest).super_TestCase.super_TestCase.super_TestNode.
          _vptr_TestNode[10])(this,(ulong)uVar10,(ulong)uVar11);
        (*(this->super_TextureBarrierBaseTest).super_TestCase.super_TestCase.super_TestNode.
          _vptr_TestNode[7])(this);
        uVar11 = uVar11 + 1;
      }
      bVar4 = verifyTextureData(this);
      uVar10 = uVar10 + 1;
    } while (bVar4);
    pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar9,"Failed to validate rendering results",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureBarrierTests.cpp"
               ,0x1ce);
    __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar9,"Program compilation failed",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureBarrierTests.cpp"
             ,0x1a0);
  __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

IterateResult iterate()
	{
		tcu::TestLog&		  log = m_testCtx.getLog();
		const glw::Functions& gl  = m_context.getRenderContext().getFunctions();

		// Compile & link the program to use
		de::SharedPtr<glu::ShaderProgram> program(
			new glu::ShaderProgram(m_context.getRenderContext(), glu::makeVtxFragSources(vsh(), fsh())));
		log << (*program);
		if (!program->isOk())
		{
			TCU_FAIL("Program compilation failed");
		}
		m_program = program->getProgram();

		gl.useProgram(m_program);

		for (GLuint i = 0; i < NUM_TEXTURES; ++i)
		{
			GLchar samplerName[] = "texInput[0]";
			samplerName[9]		 = static_cast<GLchar>('0' + i);
			GLint loc			 = gl.getUniformLocation(m_program, samplerName);
			gl.uniform1i(loc, i);
		}

		for (int testPass = 0; testPass < numTestPasses(); ++testPass)
		{
			// Initialize texture data at the beginning of each test pass
			initTextureData();

			// Perform rendering passes
			for (int renderPass = 0; renderPass < numRenderPasses(); ++renderPass)
			{
				// Setup render pass
				setupRenderPass(testPass, renderPass);

				// Render a set of primitives that cover each pixel of the framebuffer exactly once
				render();

				// If a TextureBarrier is needed insert it here
				if (needsBarrier())
					gl.textureBarrier();
			}

			// Update reference data after actual rendering to avoid bubbles
			for (int renderPass = 0; renderPass < numRenderPasses(); ++renderPass)
			{
				// Setup render pass
				setupRenderPass(testPass, renderPass);

				// Update reference data
				updateTextureData();
			}

			// Verify results at the end of each test pass
			if (!verifyTextureData())
			{
				TCU_FAIL("Failed to validate rendering results");
			}
		}

		gl.useProgram(0);

		// Test case passed
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

		return STOP;
	}